

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O0

void __thiscall
slang::ast::ReplicatedAssignmentPatternExpression::visitExprs<CollectLHSSymbols&>
          (ReplicatedAssignmentPatternExpression *this,AlwaysFFVisitor *visitor)

{
  Expression *in_RSI;
  ReplicatedAssignmentPatternExpression *in_RDI;
  AlwaysFFVisitor *in_stack_00000018;
  AssignmentPatternExpressionBase *in_stack_00000020;
  
  count(in_RDI);
  Expression::visit<CollectLHSSymbols&>(in_RSI,(AlwaysFFVisitor *)in_RDI);
  AssignmentPatternExpressionBase::visitExprs<CollectLHSSymbols&>
            (in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        count().visit(visitor);
        AssignmentPatternExpressionBase::visitExprs(visitor);
    }